

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O3

void __thiscall D5xNvmFlash::readPage(D5xNvmFlash *this,uint32_t page,uint8_t *buf)

{
  uint uVar1;
  undefined8 *puVar2;
  
  if (page < (this->super_Flash)._pages) {
    uVar1 = (this->super_Flash)._size;
    Samba::read((this->super_Flash)._samba,page * uVar1 + (this->super_Flash)._addr,buf,(ulong)uVar1
               );
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_001187a0;
  __cxa_throw(puVar2,&FlashPageError::typeinfo,std::exception::~exception);
}

Assistant:

void
D5xNvmFlash::readPage(uint32_t page, uint8_t* buf)
{
    if (page >= _pages)
    {
        throw FlashPageError();
    }

    _samba.read(_addr + (page * _size), buf, _size);
}